

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O1

REF_STATUS
ref_search_selection(REF_MPI ref_mpi,REF_INT n,REF_DBL *elements,REF_LONG position,REF_DBL *value)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  REF_LONG count;
  REF_LONG high_pos;
  REF_DBL temp;
  double local_78;
  double local_70;
  int local_64;
  long local_60;
  REF_DBL local_58;
  REF_LONG local_50;
  long local_48;
  REF_DBL *local_40;
  double local_38;
  
  local_48 = (long)n;
  uVar1 = ref_mpi_allsum(ref_mpi,&local_48,1,2);
  if (uVar1 == 0) {
    local_48 = local_48 + -1;
    local_70 = 1e+200;
    if (n < 1) {
      local_78 = -1e+200;
    }
    else {
      local_78 = -1e+200;
      local_70 = 1e+200;
      uVar2 = 0;
      do {
        dVar4 = elements[uVar2];
        if (dVar4 <= local_70) {
          local_70 = dVar4;
        }
        if (local_78 <= dVar4) {
          local_78 = dVar4;
        }
        uVar2 = uVar2 + 1;
      } while ((uint)n != uVar2);
    }
    local_38 = local_70;
    local_50 = position;
    uVar1 = ref_mpi_min(ref_mpi,&local_38,&local_70,3);
    if (uVar1 == 0) {
      uVar1 = ref_mpi_bcast(ref_mpi,&local_70,1,3);
      if (uVar1 == 0) {
        local_38 = local_78;
        uVar1 = ref_mpi_max(ref_mpi,&local_38,&local_78,3);
        if (uVar1 == 0) {
          uVar1 = ref_mpi_bcast(ref_mpi,&local_78,1,3);
          if (uVar1 == 0) {
            dVar4 = local_70;
            if ((local_50 < 1) || (dVar4 = local_78, local_48 <= local_50)) {
              *value = dVar4;
            }
            else {
              local_64 = 0;
              local_40 = value;
              do {
                local_58 = (local_70 + local_78) * 0.5;
                local_60 = 0;
                if (0 < n) {
                  uVar2 = 0;
                  lVar3 = 0;
                  do {
                    if (elements[uVar2] <= local_58) {
                      lVar3 = lVar3 + 1;
                      local_60 = lVar3;
                    }
                    uVar2 = uVar2 + 1;
                  } while ((uint)n != uVar2);
                }
                uVar1 = ref_mpi_allsum(ref_mpi,&local_60,1,2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                         ,0x1bc,"ref_search_selection",(ulong)uVar1,"bcast");
                  return uVar1;
                }
                if (local_50 < local_60) {
                  local_78 = local_58;
                }
                else {
                  local_70 = local_58;
                }
                local_64 = local_64 + 1;
              } while (local_64 != 0x28);
              *local_40 = local_58;
            }
            uVar1 = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                   ,0x1a8,"ref_search_selection",(ulong)uVar1,"bcast");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
                 0x1a7,"ref_search_selection",(ulong)uVar1,"max");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               0x1a5,"ref_search_selection",(ulong)uVar1,"bcast");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
             0x1a4,"ref_search_selection",(ulong)uVar1,"min");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0x19b,
           "ref_search_selection",(ulong)uVar1,"high_pos");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_search_selection(REF_MPI ref_mpi, REF_INT n,
                                        REF_DBL *elements, REF_LONG position,
                                        REF_DBL *value) {
  REF_INT i, bisection;
  REF_LONG low_pos, high_pos, count;
  REF_DBL low_val, high_val, temp, mid_val;
  low_pos = 0;
  high_pos = (REF_LONG)n;
  RSS(ref_mpi_allsum(ref_mpi, &high_pos, 1, REF_LONG_TYPE), "high_pos");
  high_pos--;
  low_val = REF_DBL_MAX;
  high_val = REF_DBL_MIN;
  for (i = 0; i < n; i++) {
    low_val = MIN(low_val, elements[i]);
    high_val = MAX(high_val, elements[i]);
  }
  temp = low_val;
  RSS(ref_mpi_min(ref_mpi, &temp, &low_val, REF_DBL_TYPE), "min");
  RSS(ref_mpi_bcast(ref_mpi, &low_val, 1, REF_DBL_TYPE), "bcast");
  temp = high_val;
  RSS(ref_mpi_max(ref_mpi, &temp, &high_val, REF_DBL_TYPE), "max");
  RSS(ref_mpi_bcast(ref_mpi, &high_val, 1, REF_DBL_TYPE), "bcast");

  if (position <= low_pos) {
    *value = low_val;
    return REF_SUCCESS;
  }

  if (position >= high_pos) {
    *value = high_val;
    return REF_SUCCESS;
  }

  mid_val = 0.5 * (low_val + high_val); /* ensure initialized */
  for (bisection = 0; bisection < 40; bisection++) {
    mid_val = 0.5 * (low_val + high_val);
    count = 0;
    for (i = 0; i < n; i++) {
      if (elements[i] <= mid_val) count++;
    }

    RSS(ref_mpi_allsum(ref_mpi, &count, 1, REF_LONG_TYPE), "bcast");
    /* printf("pos  %ld %ld %ld val %f %f %f\n",
               low_pos, count, high_pos, low_val,
               mid_val, high_val);*/
    if (count - 1 < position) {
      low_val = mid_val;
    } else {
      high_val = mid_val;
    }
  }
  *value = mid_val;
  return REF_SUCCESS;
}